

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O2

bool __thiscall deqp::gls::UniformBlockCase::render(UniformBlockCase *this,deUint32 program)

{
  string *this_00;
  RenderContext *context;
  TestLog *pTVar1;
  UniformBlockCase *pUVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  undefined4 extraout_var;
  int *piVar7;
  Surface *surface;
  void *__buf;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  allocator<char> local_25a;
  allocator<char> local_259;
  int local_258;
  deUint32 local_254;
  deUint16 indices [6];
  undefined4 uStack_244;
  string local_238;
  TestLog *local_218;
  UniformBlockCase *local_210;
  float position [16];
  Random rnd;
  VertexArrayBinding posArray;
  long lVar6;
  undefined4 extraout_var_00;
  
  local_218 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_254 = program;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  local_210 = this;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  piVar7 = (int *)CONCAT44(extraout_var_00,iVar3);
  iVar3 = *piVar7;
  iVar8 = 0x80;
  if (iVar3 < 0x80) {
    iVar8 = iVar3;
  }
  iVar9 = 0x80;
  if (piVar7[1] < 0x80) {
    iVar9 = piVar7[1];
  }
  iVar3 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar3 - iVar8);
  iVar5 = de::Random::getInt((Random *)&rnd.m_rnd,0,piVar7[1] - iVar9);
  (**(code **)(lVar6 + 0x1c0))(0x3e000000,0x3e800000,0x3f000000,0x3f800000);
  (**(code **)(lVar6 + 0x188))(0x4500);
  position[0xc] = 1.0;
  position[0xd] = 1.0;
  position[0xe] = 0.0;
  position[0xf] = 1.0;
  position[8] = 1.0;
  position[9] = -1.0;
  position[10] = 0.0;
  position[0xb] = 1.0;
  position[4] = -1.0;
  position[5] = 1.0;
  position[6] = 0.0;
  position[7] = 1.0;
  position[0] = -1.0;
  position[1] = -1.0;
  position[2] = 0.0;
  position[3] = 1.0;
  indices[0] = 0;
  indices[1] = 1;
  indices[2] = 2;
  indices[3] = 2;
  indices[4] = 1;
  indices[5] = 3;
  local_258 = iVar3;
  (**(code **)(lVar6 + 0x1a00))(iVar3,iVar5,iVar8,iVar9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"a_position",&local_25a);
  glu::va::Float(&posArray,&local_238,4,4,0,position);
  pUVar2 = local_210;
  std::__cxx11::string::~string((string *)&local_238);
  local_238._M_dataplus._M_p = (pointer)0x600000000;
  local_238._M_string_length._0_4_ = 1;
  local_238.field_2._M_allocated_capacity = (size_type)indices;
  glu::draw(pUVar2->m_renderCtx,local_254,1,&posArray,(PrimitiveList *)&local_238,
            (DrawUtilCallback *)0x0);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                  ,0x781);
  std::__cxx11::string::~string((string *)&posArray.binding.name);
  tcu::Surface::Surface((Surface *)indices,iVar8,iVar9);
  context = pUVar2->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&posArray,(Surface *)indices);
  glu::readPixels(context,local_258,iVar5,(PixelBufferAccess *)&posArray);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  pTVar1 = local_218;
  glu::checkError(dVar4,"Reading pixels failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                  ,0x78a);
  iVar3 = 0;
  uVar10 = 0;
  if (0 < (int)indices._0_4_) {
    uVar10 = indices._0_8_ & 0xffffffff;
  }
  iVar8 = indices._4_4_;
  if ((int)indices._4_4_ < 1) {
    iVar8 = 0;
  }
  iVar9 = 0;
  for (iVar5 = 0; uVar12 = uVar10, iVar11 = iVar3, iVar5 != iVar8; iVar5 = iVar5 + 1) {
    while (uVar12 != 0) {
      iVar9 = iVar9 + (uint)(*(int *)(CONCAT44(uStack_244,indices._8_4_) + (long)iVar11 * 4) != -1);
      uVar12 = uVar12 - 1;
      iVar11 = iVar11 + 1;
    }
    iVar3 = iVar3 + indices._0_4_;
  }
  if (0 < iVar9) {
    std::__cxx11::string::string<std::allocator<char>>((string *)position,"Image",&local_25a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"Rendered image",&local_259);
    surface = (Surface *)indices;
    tcu::LogImage::LogImage
              ((LogImage *)&posArray,(string *)position,&local_238,surface,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&posArray,(int)pTVar1,__buf,(size_t)surface);
    tcu::LogImage::~LogImage((LogImage *)&posArray);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)position);
    posArray.binding._0_8_ = pTVar1;
    this_00 = &posArray.binding.name;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Image comparison failed, got ");
    std::ostream::operator<<(this_00,iVar9);
    std::operator<<((ostream *)this_00," non-white pixels");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&posArray,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  tcu::Surface::~Surface((Surface *)indices);
  return iVar9 == 0;
}

Assistant:

bool UniformBlockCase::render (deUint32 program) const
{
	tcu::TestLog&				log				= m_testCtx.getLog();
	const glw::Functions&		gl				= m_renderCtx.getFunctions();
	de::Random					rnd				(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget	= m_renderCtx.getRenderTarget();
	const int					viewportW		= de::min(renderTarget.getWidth(),	128);
	const int					viewportH		= de::min(renderTarget.getHeight(),	128);
	const int					viewportX		= rnd.getInt(0, renderTarget.getWidth()		- viewportW);
	const int					viewportY		= rnd.getInt(0, renderTarget.getHeight()	- viewportH);

	gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Draw
	{
		const float position[] =
		{
			-1.0f, -1.0f, 0.0f, 1.0f,
			-1.0f, +1.0f, 0.0f, 1.0f,
			+1.0f, -1.0f, 0.0f, 1.0f,
			+1.0f, +1.0f, 0.0f, 1.0f
		};
		const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

		gl.viewport(viewportX, viewportY, viewportW, viewportH);

		glu::VertexArrayBinding posArray = glu::va::Float("a_position", 4, 4, 0, &position[0]);
		glu::draw(m_renderCtx, program, 1, &posArray,
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
	}

	// Verify that all pixels are white.
	{
		tcu::Surface	pixels			(viewportW, viewportH);
		int				numFailedPixels = 0;

		glu::readPixels(m_renderCtx, viewportX, viewportY, pixels.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

		for (int y = 0; y < pixels.getHeight(); y++)
		{
			for (int x = 0; x < pixels.getWidth(); x++)
			{
				if (pixels.getPixel(x, y) != tcu::RGBA::white())
					numFailedPixels += 1;
			}
		}

		if (numFailedPixels > 0)
		{
			log << TestLog::Image("Image", "Rendered image", pixels);
			log << TestLog::Message << "Image comparison failed, got " << numFailedPixels << " non-white pixels" << TestLog::EndMessage;
		}

		return numFailedPixels == 0;
	}
}